

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O2

int Ga2_GlaAbsCount(Ga2_Man_t *p,int fRo,int fAnd)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  int iVar5;
  
  if (fRo == 0) {
    if (fAnd == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absGla.c"
                    ,0x54a,"int Ga2_GlaAbsCount(Ga2_Man_t *, int, int)");
    }
    iVar4 = 0;
    for (iVar5 = 0; iVar5 < p->vAbs->nSize; iVar5 = iVar5 + 1) {
      pGVar1 = p->pGia;
      iVar2 = Vec_IntEntry(p->vAbs,iVar5);
      pGVar3 = Gia_ManObj(pGVar1,iVar2);
      if (pGVar3 == (Gia_Obj_t *)0x0) {
        return iVar4;
      }
      iVar4 = iVar4 + (uint)((~*(uint *)pGVar3 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar3);
    }
  }
  else {
    iVar4 = 0;
    for (iVar5 = 0; iVar5 < p->vAbs->nSize; iVar5 = iVar5 + 1) {
      pGVar1 = p->pGia;
      iVar2 = Vec_IntEntry(p->vAbs,iVar5);
      pGVar3 = Gia_ManObj(pGVar1,iVar2);
      if (pGVar3 == (Gia_Obj_t *)0x0) {
        return iVar4;
      }
      iVar2 = Gia_ObjIsRo(p->pGia,pGVar3);
      iVar4 = iVar4 + iVar2;
    }
  }
  return iVar4;
}

Assistant:

int Ga2_GlaAbsCount( Ga2_Man_t * p, int fRo, int fAnd )
{
    Gia_Obj_t * pObj;
    int i, Counter = 0;
    if ( fRo )
        Gia_ManForEachObjVec( p->vAbs, p->pGia, pObj, i )
            Counter += Gia_ObjIsRo(p->pGia, pObj);
    else if ( fAnd )
        Gia_ManForEachObjVec( p->vAbs, p->pGia, pObj, i )
            Counter += Gia_ObjIsAnd(pObj);
    else assert( 0 );
    return Counter;
}